

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

void __thiscall calculator::Function::~Function(Function *this)

{
  Word::~Word(&this->super_Word);
  operator_delete(this,0x70);
  return;
}

Assistant:

Function(const std::string& name, bool minus = false)
        : Word(name, minus, Tag::Function) {}